

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::RegisterSharedValidationInterface
          (ValidationSignals *this,shared_ptr<CValidationInterface> *callbacks)

{
  long in_FS_OFFSET;
  ValidationSignalsImpl *unaff_retaddr;
  shared_ptr<CValidationInterface> *in_stack_ffffffffffffffa8;
  shared_ptr<CValidationInterface> *callbacks_00;
  
  callbacks_00 = *(shared_ptr<CValidationInterface> **)(in_FS_OFFSET + 0x28);
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             in_stack_ffffffffffffffa8);
  std::shared_ptr<CValidationInterface>::shared_ptr
            (in_stack_ffffffffffffffa8,(shared_ptr<CValidationInterface> *)0x14f3578);
  ValidationSignalsImpl::Register(unaff_retaddr,callbacks_00);
  std::shared_ptr<CValidationInterface>::~shared_ptr(in_stack_ffffffffffffffa8);
  if (*(shared_ptr<CValidationInterface> **)(in_FS_OFFSET + 0x28) == callbacks_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::RegisterSharedValidationInterface(std::shared_ptr<CValidationInterface> callbacks)
{
    // Each connection captures the shared_ptr to ensure that each callback is
    // executed before the subscriber is destroyed. For more details see #18338.
    m_internals->Register(std::move(callbacks));
}